

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O3

void ncnn::convolution_im2col_gemm_get_optimal_tile_mnk
               (int M,int N,int K,int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  iVar1 = get_cpu_level2_cache_size();
  iVar1 = iVar1 >> 2;
  if (nT == 0) {
    nT = get_physical_big_cpu_count();
  }
  iVar2 = iVar1 + 0x1f;
  if (-1 < iVar1 + -0x20) {
    iVar2 = iVar1 + -0x20;
  }
  uVar6 = (iVar2 >> 6) * 8;
  if ((int)uVar6 < 9) {
    uVar6 = 8;
  }
  iVar2 = (int)(K + uVar6 + -1) / (int)uVar6;
  iVar2 = (K + iVar2 + -1) / iVar2;
  uVar3 = iVar2 + 7;
  uVar4 = iVar2 + 0xe;
  if (-1 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar3 = uVar4 & 0xfffffff8;
  if ((int)uVar6 <= (int)(uVar4 & 0xfffffff8)) {
    uVar3 = uVar6;
  }
  *TILE_K = uVar3;
  iVar2 = M + 0x3e;
  if (-1 < M + 0x1f) {
    iVar2 = M + 0x1f;
  }
  iVar2 = ((iVar2 >> 5) + M + -1) / (iVar2 >> 5);
  uVar4 = iVar2 + 7;
  uVar6 = iVar2 + 0xe;
  if (-1 < (int)uVar4) {
    uVar6 = uVar4;
  }
  uVar6 = uVar6 & 0xfffffff8;
  if ((int)uVar6 < 9) {
    uVar6 = 8;
  }
  *TILE_M = uVar6;
  iVar2 = get_physical_cpu_count();
  if (nT <= iVar2) {
    iVar2 = nT;
  }
  uVar3 = iVar2 * *TILE_M;
  iVar2 = (int)(uVar3 + M + -1) / (int)uVar3;
  iVar2 = (iVar2 + M + -1) / iVar2;
  uVar4 = iVar2 + 7;
  uVar6 = iVar2 + 0xe;
  if (-1 < (int)uVar4) {
    uVar6 = uVar4;
  }
  uVar4 = uVar6 & 0xfffffff8;
  if ((int)uVar3 <= (int)(uVar6 & 0xfffffff8)) {
    uVar4 = uVar3;
  }
  uVar6 = uVar4;
  if (1 < nT) {
    iVar2 = 1;
    if (1 < (int)uVar4 / nT) {
      iVar2 = (int)uVar4 / nT;
    }
    uVar6 = iVar2 + 7U & 0x7ffffff8;
    if ((int)uVar4 <= (int)uVar6) {
      uVar6 = uVar4;
    }
  }
  *TILE_M = uVar6;
  if (0 < N) {
    iVar2 = *TILE_K;
    uVar4 = uVar6;
    if (K <= iVar2) {
      uVar4 = 0;
    }
    uVar6 = (int)(iVar1 - uVar6 * iVar2) / (int)(uVar4 + iVar2);
    uVar4 = uVar6 + 3;
    if (-1 < (int)uVar6) {
      uVar4 = uVar6;
    }
    uVar5 = (ulong)(uVar4 & 0xfffffffc);
    if ((int)(uVar4 & 0xfffffffc) < 5) {
      uVar5 = 4;
    }
    uVar6 = (uint)uVar5;
    uVar5 = ((N + uVar6) - 1) / uVar5;
    uVar4 = (int)(((N + (int)uVar5) - 1) / uVar5) + 3U & 0xfffffffc;
    if (uVar6 <= uVar4) {
      uVar4 = uVar6;
    }
    if (uVar4 < 5) {
      uVar4 = 4;
    }
    *TILE_N = uVar4;
  }
  return;
}

Assistant:

static void convolution_im2col_gemm_get_optimal_tile_mnk(int M, int N, int K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const int l2_cache_size_fp32 = (int)(get_cpu_level2_cache_size() / sizeof(float));

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    // solve K
    {
        // try not to split K
#if __AVX512F__
        int tile_size = (l2_cache_size_fp32 - 64) / 16;
#elif __AVX__
        int tile_size = (l2_cache_size_fp32 - 32) / 8;
#elif __SSE2__
        int tile_size = (l2_cache_size_fp32 - 16) / 8;
#else
        int tile_size = (l2_cache_size_fp32 - 2) / 3;
#endif

#if __AVX512F__
        TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_K = std::max(4, tile_size / 4 * 4);
#else
        TILE_K = std::max(2, tile_size / 2 * 2);
#endif

        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif
    }

    // solve M
    {
#if __AVX512F__
        int nn_M = (M + 63) / 64;
#elif __AVX__
        int nn_M = (M + 31) / 32;
#elif __SSE2__
        int nn_M = (M + 15) / 16;
#else
        int nn_M = (M + 7) / 8;
#endif

#if __AVX512F__
        TILE_M = std::max(16, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::max(8, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::max(4, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::max(2, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif
    }

    {
        TILE_M *= std::min(nT, get_physical_cpu_count());

        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif

        if (nT > 1)
        {
#if __AVX512F__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
        }
    }

    if (N > 0)
    {
        int tile_size;
        if (TILE_K >= K)
        {
            tile_size = (l2_cache_size_fp32 - TILE_M * TILE_K) / TILE_K;
        }
        else
        {
            tile_size = (l2_cache_size_fp32 - TILE_M * TILE_K) / (TILE_M + TILE_K);
        }

#if __AVX512F__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
        TILE_N = std::max(4, tile_size / 4 * 4);
#else
        TILE_N = std::max(1, tile_size);
#endif

        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif

#if __AVX512F__
        TILE_N = std::max(4, TILE_N);
#elif __AVX__
        TILE_N = std::max(4, TILE_N);
#elif __SSE2__
        TILE_N = std::max(4, TILE_N);
#else
        TILE_N = std::max(1, TILE_N);
#endif
    }
}